

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udplayer.cc
# Opt level: O3

ostream * operator<<(ostream *out,sockaddr_in *addr)

{
  ostream *poVar1;
  string local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"[",1);
  bdnet_inet_ntoa_abi_cxx11_(&local_38,(in_addr)(addr->sin_addr).s_addr);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,":",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"]",1);
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, struct sockaddr_in &addr) {
	out << "[" << bdnet_inet_ntoa(addr.sin_addr) << ":";
	out << htons(addr.sin_port) << "]";
	return out;
}